

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

void test_next_on_array(uint32_t count)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  char *local_30;
  char *d3;
  char *d2;
  uint32_t len;
  uint32_t i;
  char *d1;
  uint32_t count_local;
  
  d1._4_4_ = count;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"next/check on array(%u)",(ulong)d1._4_4_);
  d1._0_4_ = fprintf(_stdout,"\n");
  _len = data;
  _len = mp_encode_array(data,d1._4_4_);
  for (d2._4_4_ = 0; uVar1 = d1._4_4_, d2._4_4_ < d1._4_4_; d2._4_4_ = d2._4_4_ + 1) {
    _len = mp_encode_uint(_len,(ulong)d2._4_4_ % 0x7f);
  }
  uVar2 = mp_sizeof_array(d1._4_4_);
  d2._0_4_ = uVar1 + uVar2;
  d3 = data;
  local_30 = data;
  iVar3 = mp_check(&d3,data + 0x3ffff);
  _ok((uint)((iVar3 != 0 ^ 0xffU) & 1),"!mp_check(&d2, data + BUF_MAXLEN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2a9,
      "mp_check(array %u))",(ulong)d1._4_4_);
  _ok((uint)((long)_len - (long)data == (ulong)(uint)d2),"(d1 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2aa,
      "len(array %u) == %u",(ulong)d1._4_4_,(uint)d2);
  _ok((uint)((long)d3 - (long)data == (ulong)(uint)d2),"(d2 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2ab,
      "len(mp_check(array %u)) == %u",(ulong)d1._4_4_,(uint)d2);
  mp_next(&local_30);
  _ok((uint)((long)local_30 - (long)data == (ulong)(uint)d2),"(d3 - data) == (ptrdiff_t)len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x2ad,
      "len(mp_next(array %u)) == %u",(ulong)d1._4_4_,(uint)d2);
  return;
}

Assistant:

static void
test_next_on_array(uint32_t count)
{
	note("next/check on array(%u)", count);
	char *d1 = data;
	d1 = mp_encode_array(d1, count);
	for (uint32_t i = 0; i < count; i++) {
		d1 = mp_encode_uint(d1, i % 0x7f); /* one byte */
	}
	uint32_t len = count + mp_sizeof_array(count);
	const char *d2 = data;
	const char *d3 = data;
	ok(!mp_check(&d2, data + BUF_MAXLEN), "mp_check(array %u))", count);
	is((d1 - data), (ptrdiff_t)len, "len(array %u) == %u", count, len);
	is((d2 - data), (ptrdiff_t)len, "len(mp_check(array %u)) == %u", count, len);
	mp_next(&d3);
	is((d3 - data), (ptrdiff_t)len, "len(mp_next(array %u)) == %u", count, len);
}